

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

void prepare_keyvalue(char *keyvalue)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  int local_14;
  int length;
  int i;
  char *keyvalue_local;
  
  sVar2 = strlen(keyvalue);
  iVar1 = (int)sVar2;
  if ((*keyvalue == '\'') && (keyvalue[iVar1 + -1] == '\'')) {
    for (local_14 = 0; local_14 < iVar1 + -2; local_14 = local_14 + 1) {
      keyvalue[local_14] = keyvalue[local_14 + 1];
    }
    keyvalue[iVar1 + -2] = '\0';
  }
  sVar2 = strlen(keyvalue);
  iVar1 = (int)sVar2 + -1;
  local_14 = 0;
  while( true ) {
    bVar3 = false;
    if (local_14 < iVar1) {
      bVar3 = keyvalue[local_14] == ' ';
    }
    if (!bVar3) break;
    local_14 = local_14 + 1;
  }
  bVar3 = local_14 != iVar1;
  local_14 = iVar1;
  if (bVar3) {
    while( true ) {
      bVar3 = false;
      if (-1 < local_14) {
        bVar3 = keyvalue[local_14] == ' ';
      }
      if (!bVar3) break;
      keyvalue[local_14] = '\0';
      local_14 = local_14 + -1;
    }
  }
  return;
}

Assistant:

void prepare_keyvalue(char *keyvalue) /* string containing keyword value     */

/*
  strip off all single quote characters "'" and blank spaces from a keyword
  value retrieved via fits_read_key*() routines

  this is necessary so that a standard comparision of keyword values may
  be made
*/

{

  int i;
  int length;

  /*
    strip off any leading or trailing single quotes (`) and (') from
    the keyword value
  */

  length = strlen(keyvalue) - 1;

  if(keyvalue[0] == '\'' && keyvalue[length] == '\'')
    {
      for(i = 0; i < length - 1; ++i) keyvalue[i] = keyvalue[i+1];
      keyvalue[length-1] = 0;
    }
  
  /*
    strip off any trailing blanks from the keyword value; note that if the
    keyvalue consists of nothing but blanks then no blanks are stripped
  */

  length = strlen(keyvalue) - 1;

  for(i = 0; i < length && keyvalue[i] == ' '; ++i);

  if(i != length)
    {
      for(i = length; i >= 0 && keyvalue[i] == ' '; --i) keyvalue[i] = '\0';
    }
}